

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O0

void mkcavepos(xchar x,xchar y,int dist,boolean waslit,boolean rockit)

{
  level *plVar1;
  char cVar2;
  schar sVar3;
  trap *ptVar4;
  monst *local_30;
  monst *mtmp;
  rm *loc;
  boolean rockit_local;
  boolean waslit_local;
  int dist_local;
  xchar y_local;
  xchar x_local;
  
  plVar1 = level;
  if (((('\0' < x) && (x < 'P')) && (-1 < y)) && (y < '\x15')) {
    if (rockit == '\0') {
      if (level->locations[x][y].typ == '\x19') {
        return;
      }
    }
    else {
      if (level->locations[x][y].typ < '\x11') {
        return;
      }
      ptVar4 = t_at(level,(int)x,(int)y);
      if (ptVar4 != (trap *)0x0) {
        return;
      }
      if ((level->monsters[x][y] == (monst *)0x0) ||
         ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
        local_30 = (monst *)0x0;
      }
      else {
        local_30 = level->monsters[x][y];
      }
      if ((local_30 != (monst *)0x0) && ((local_30->data->mflags1 & 8) == 0)) {
        rloc(level,local_30,'\0');
      }
    }
    unblock_point((int)x,(int)y);
    plVar1->locations[x][y].seenv = '\0';
    *(uint *)&plVar1->locations[x][y].field_0x6 =
         *(uint *)&plVar1->locations[x][y].field_0x6 & 0xfffffe0f;
    if (dist < 3) {
      *(uint *)&plVar1->locations[x][y].field_0x6 =
           *(uint *)&plVar1->locations[x][y].field_0x6 & 0xfffffbff | (uint)(rockit == '\0') << 10;
    }
    if (waslit != '\0') {
      *(uint *)&plVar1->locations[x][y].field_0x6 =
           *(uint *)&plVar1->locations[x][y].field_0x6 & 0xfffff7ff | (uint)(rockit == '\0') << 0xb;
    }
    *(uint *)&plVar1->locations[x][y].field_0x6 =
         *(uint *)&plVar1->locations[x][y].field_0x6 & 0xfffffdff;
    cVar2 = '\x01';
    if (dist < 3) {
      cVar2 = '\x03';
    }
    viz_array[y][x] = cVar2;
    sVar3 = '\x19';
    if (rockit != '\0') {
      sVar3 = '\0';
    }
    plVar1->locations[x][y].typ = sVar3;
    if (2 < dist) {
      impossible("mkcavepos called with dist %d",(ulong)(uint)dist);
    }
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      newsym((int)x,(int)y);
    }
    else {
      feel_location(x,y);
    }
  }
  return;
}

Assistant:

static void mkcavepos(xchar x, xchar y, int dist, boolean waslit, boolean rockit)
{
    struct rm *loc;

    if (!isok(x,y)) return;
    loc = &level->locations[x][y];

    if (rockit) {
	struct monst *mtmp;

	if (IS_ROCK(loc->typ)) return;
	if (t_at(level, x, y)) return; /* don't cover the portal */
	if ((mtmp = m_at(level, x, y)) != 0)	/* make sure crucial monsters survive */
	    if (!passes_walls(mtmp->data)) rloc(level, mtmp, FALSE);
    } else if (loc->typ == ROOM) return;

    unblock_point(x,y);	/* make sure vision knows this location is open */

    /* fake out saved state */
    loc->seenv = 0;
    loc->doormask = 0;
    if (dist < 3) loc->lit = (rockit ? FALSE : TRUE);
    if (waslit) loc->waslit = (rockit ? FALSE : TRUE);
    loc->horizontal = FALSE;
    viz_array[y][x] = (dist < 3 ) ?
	(IN_SIGHT|COULD_SEE) : /* short-circuit vision recalc */
	COULD_SEE;
    loc->typ = (rockit ? STONE : ROOM);
    if (dist >= 3)
	impossible("mkcavepos called with dist %d", dist);
    if (Blind)
	feel_location(x, y);
    else newsym(x,y);
}